

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  value_type *__x;
  pointer pAVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  pointer pbVar3;
  bool bVar4;
  Type TVar5;
  pointer pTVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  runtime_error *this_00;
  pointer pAVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  ostringstream oss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_248;
  string *local_240;
  ConfigData *local_238;
  CommandLine<Catch::ConfigData> *local_230;
  string local_208 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar6 = (tokens->
           super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_248 = __return_storage_ptr__;
  local_238 = config;
  local_230 = this;
  if ((tokens->
      super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>)
      ._M_impl.super__Vector_impl_data._M_finish != pTVar6) {
    uVar10 = 0;
    do {
      __x = pTVar6 + uVar10;
      pAVar8 = (local_230->m_options).
               super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar1 = (local_230->m_options).
               super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = uVar10;
      if (pAVar8 == pAVar1) {
LAB_0014547e:
        uVar10 = uVar9;
        if (pAVar8 == pAVar1) goto LAB_00145483;
      }
      else {
        local_240 = &__x->data;
        do {
          TVar5 = __x->type;
          if (TVar5 == ShortOpt) {
            _Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((pAVar8->super_OptionArgProperties).shortNames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (pAVar8->super_OptionArgProperties).shortNames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,local_240);
            if (_Var7._M_current ==
                (pAVar8->super_OptionArgProperties).shortNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              TVar5 = __x->type;
              goto LAB_00145173;
            }
LAB_00145192:
            if ((pAVar8->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length
                == 0) {
              local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"true","");
              pIVar2 = (pAVar8->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj
              ;
              (*pIVar2->_vptr_IArgFunction[2])(pIVar2,local_238,local_1a8);
            }
            else {
              pTVar6 = (tokens->
                       super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((uVar10 != ((long)(tokens->
                                    super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 3)
                             * -0x3333333333333333 - 1U) &&
                 (uVar9 = uVar10 + 1, pTVar6[uVar9].type == Positional)) {
                pIVar2 = (pAVar8->super_CommonArgProperties<Catch::ConfigData>).boundField.
                         functionObj;
                (*pIVar2->_vptr_IArgFunction[2])(pIVar2,local_238,&pTVar6[uVar9].data);
                goto LAB_0014547e;
              }
              std::operator+(local_1a8,"Expected argument to option: ",local_240);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_268,local_1a8);
            }
            uVar9 = uVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p);
            }
            goto LAB_0014547e;
          }
LAB_00145173:
          if ((TVar5 == LongOpt) &&
             (bVar4 = OptionArgProperties::hasLongName(&pAVar8->super_OptionArgProperties,local_240)
             , bVar4)) goto LAB_00145192;
          pAVar8 = pAVar8 + 1;
        } while (pAVar8 != pAVar1);
LAB_00145483:
        if ((__x->type == Positional) || (local_230->m_throwOnUnrecognisedTokens == false)) {
          std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
          push_back(local_248,__x);
        }
        else if (local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(local_1a8,"unrecognised option: ",&__x->data);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268
                     ,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
        }
      }
      uVar10 = uVar10 + 1;
      pTVar6 = (tokens->
               super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)(((long)(tokens->
                                     super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 3
                              ) * -0x3333333333333333));
    if (local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pbVar3 = local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar11 = local_268.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pbVar11 !=
              local_268.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar3);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_208);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  return local_248;
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            std::vector<std::string> errors;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    errors.push_back( "Expected argument to option: " + token.data );
                                else
                                    arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.set( config, "true" );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        errors.push_back( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd ) {
                    if( token.type == Parser::Token::Positional || !m_throwOnUnrecognisedTokens )
                        unusedTokens.push_back( token );
                    else if( errors.empty() && m_throwOnUnrecognisedTokens )
                        errors.push_back( "unrecognised option: " + token.data );
                }
            }
            if( !errors.empty() ) {
                std::ostringstream oss;
                for( std::vector<std::string>::const_iterator it = errors.begin(), itEnd = errors.end();
                        it != itEnd;
                        ++it ) {
                    if( it != errors.begin() )
                        oss << "\n";
                    oss << *it;
                }
                throw std::runtime_error( oss.str() );
            }
            return unusedTokens;
        }